

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O1

void __thiscall CGL::RaytracedRenderer::~RaytracedRenderer(RaytracedRenderer *this)

{
  BVHAccel *this_00;
  PathTracer *this_01;
  pointer pcVar1;
  pointer pLVar2;
  pointer pWVar3;
  pointer pptVar4;
  pointer piVar5;
  pointer puVar6;
  
  (this->super_OfflineRenderer)._vptr_OfflineRenderer =
       (_func_int **)&PTR__RaytracedRenderer_002a56a8;
  this_00 = this->bvh;
  if (this_00 != (BVHAccel *)0x0) {
    CGL::SceneObjects::BVHAccel::~BVHAccel(this_00);
    operator_delete(this_00);
  }
  this_01 = this->pt;
  if (this_01 != (PathTracer *)0x0) {
    CGL::PathTracer::~PathTracer(this_01);
    operator_delete(this_01);
  }
  pcVar1 = (this->filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename).field_2) {
    operator_delete(pcVar1);
  }
  pLVar2 = (this->rayLog).super__Vector_base<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pLVar2 != (pointer)0x0) {
    operator_delete(pLVar2);
  }
  std::_Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>::
  ~_Deque_base((_Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
                *)&this->selectionHistory);
  std::condition_variable::~condition_variable(&this->cv_done);
  pWVar3 = (this->workQueue).storage.
           super__Vector_base<CGL::WorkItem,_std::allocator<CGL::WorkItem>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pWVar3 != (pointer)0x0) {
    operator_delete(pWVar3);
  }
  pptVar4 = (this->workerThreads).super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (pptVar4 != (pointer)0x0) {
    operator_delete(pptVar4);
  }
  piVar5 = (this->sampleCountBuffer).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5);
  }
  puVar6 = (this->frameBuffer).data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6);
  }
  pcVar1 = (this->ghost_aperture_filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->ghost_aperture_filename).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->aperture_filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->aperture_filename).field_2) {
    operator_delete(pcVar1);
  }
  piVar5 = (this->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5);
    return;
  }
  return;
}

Assistant:

RaytracedRenderer::~RaytracedRenderer() {

  delete bvh;
  delete pt;

}